

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O0

void __thiscall
ktx::Reporter::warning<char_const(&)[71],std::__cxx11::string_const&>
          (Reporter *this,char (*args) [71],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  size_t sVar1;
  ostream *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  ostream *in_stack_ffffffffffffff50;
  basic_string_view<char> in_stack_ffffffffffffff58;
  
  std::char_traits<char>::length((char_type *)0x1f5fb1);
  ::fmt::v10::print<std::__cxx11::string&>
            (in_stack_ffffffffffffff50,
             (format_string<std::__cxx11::basic_string<char>_&>)in_stack_ffffffffffffff58,
             in_stack_ffffffffffffff48);
  sVar1 = std::char_traits<char>::length((char_type *)0x1f6047);
  ::fmt::v10::print<std::__cxx11::string_const&>
            (in_RSI,(format_string<const_std::__cxx11::basic_string<char>_&>)
                    in_stack_ffffffffffffff58,in_stack_ffffffffffffff48);
  std::char_traits<char>::length((char_type *)0x1f60d3);
  ::fmt::v10::print<>(in_RSI,(format_string<>)in_stack_ffffffffffffff58);
  return;
}

Assistant:

void warning(Args&&... args) {
        fmt::print(std::cerr, "{} warning: ", commandName);
        fmt::print(std::cerr, std::forward<Args>(args)...);
        fmt::print(std::cerr, "\n");
    }